

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1bf255::BuildSystemRule::BuildSystemRule
          (BuildSystemRule *this,KeyType *key,CommandSignature *signature,
          function<llbuild::core::Task_*(llbuild::core::BuildEngine_&)> *action,
          function<bool_(llbuild::core::BuildEngine_&,_const_llbuild::core::Rule_&,_const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
          *valid,function<void_(llbuild::core::BuildEngine_&,_llbuild::core::Rule::StatusKind)>
                 *update)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR___cxa_pure_virtual_0025ac70;
  (this->super_Rule).key.key._M_dataplus._M_p = (pointer)&(this->super_Rule).key.key.field_2;
  pcVar1 = (key->key)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Rule).key,pcVar1,pcVar1 + (key->key)._M_string_length);
  (this->super_Rule).signature.value = signature->value;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__BuildSystemRule_00256e38;
  *(undefined8 *)&(this->action).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->action).super__Function_base._M_functor + 8) = 0;
  (this->action).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->action)._M_invoker = (_Invoker_type)0x0;
  p_Var2 = (action->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->action,(_Any_data *)action,__clone_functor);
    (this->action)._M_invoker = action->_M_invoker;
    (this->action).super__Function_base._M_manager = (action->super__Function_base)._M_manager;
  }
  (this->resultValid).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->resultValid)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->resultValid).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->resultValid).super__Function_base._M_functor + 8) = 0;
  p_Var2 = (valid->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->resultValid,(_Any_data *)valid,__clone_functor);
    (this->resultValid)._M_invoker = valid->_M_invoker;
    (this->resultValid).super__Function_base._M_manager = (valid->super__Function_base)._M_manager;
  }
  (this->update).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->update)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->update).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->update).super__Function_base._M_functor + 8) = 0;
  p_Var2 = (update->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->update,(_Any_data *)update,__clone_functor);
    (this->update)._M_invoker = update->_M_invoker;
    (this->update).super__Function_base._M_manager = (update->super__Function_base)._M_manager;
  }
  return;
}

Assistant:

BuildSystemRule(
    const KeyType& key,
    const basic::CommandSignature& signature,
    std::function<Task*(BuildEngine&)> action,
    std::function<bool(BuildEngine&, const Rule&, const ValueType&)> valid = nullptr,
    std::function<void(BuildEngine&, StatusKind)> update = nullptr)
  : Rule(key, signature), action(action), resultValid(valid), update(update)
  { }